

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * printStmt(void)

{
  treeNode *this;
  treeNode *extraout_RAX;
  double __x;
  allocator local_69;
  string local_68;
  undefined1 local_45;
  allocator local_31;
  string local_30;
  treeNode *local_10;
  treeNode *ret;
  
  this = (treeNode *)operator_new(0x58);
  local_45 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  treeNode::treeNode(this,printStmt,&local_30);
  local_45 = 0;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"print",&local_69);
  match(&local_68,Empty);
  std::__cxx11::string::~string((string *)&local_68);
  __x = (double)std::allocator<char>::~allocator((allocator<char> *)&local_69);
  exp(__x);
  local_10->child[0] = extraout_RAX;
  return local_10;
}

Assistant:

treeNode* printStmt()
{
    auto ret = new treeNode(StmtKind::printStmt,"");
    match("print");
    ret->child[0]=exp();
    return ret;
}